

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

bool __thiscall
ctemplate::SectionTemplateNode::AddSubnode(SectionTemplateNode *this,Template *my_template)

{
  ulong uVar1;
  bool bVar2;
  TemplateState TVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  undefined4 local_d8;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  ctemplate local_88 [48];
  undefined1 local_58 [8];
  TemplateToken token;
  bool auto_escape_success;
  Template *my_template_local;
  SectionTemplateNode *this_local;
  
  token.modvals.
  super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  TVar3 = Template::state(my_template);
  if (TVar3 == TS_ERROR) {
    return false;
  }
  if ((my_template->parse_state_).bufend <= (my_template->parse_state_).bufstart) {
    if ((this->token_).text != "__{{MAIN}}__") {
      poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar5 = std::operator<<(poVar5,"Template ");
      pcVar6 = Template::template_file(my_template);
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::operator<<(poVar5,": ");
      poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar5 = std::operator<<(poVar5,"File ended before all sections were closed");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      Template::set_state(my_template,TS_ERROR);
    }
    return false;
  }
  GetNextToken((TemplateToken *)local_58,this,my_template);
  switch(local_58._0_4_) {
  case 1:
    token.modvals.
    super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
         AddTextNode(this,(TemplateToken *)local_58,my_template);
    bVar2 = std::operator==(&this->indentation_,"\n");
    GetIndentation_abi_cxx11_(local_88,(char *)token._0_8_,(size_t)token.text,bVar2);
    std::__cxx11::string::operator=((string *)&this->indentation_,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    break;
  case 2:
    token.modvals.
    super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
         AddVariableNode(this,(TemplateToken *)local_58,my_template);
    std::__cxx11::string::clear();
    break;
  case 3:
    token.modvals.
    super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
         AddSectionNode(this,(TemplateToken *)local_58,my_template,false);
    std::__cxx11::string::clear();
    break;
  case 4:
    if ((token.text != (char *)(this->token_).textlen) ||
       (iVar4 = memcmp((void *)token._0_8_,(this->token_).text,(size_t)token.text), iVar4 != 0)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar5 = std::operator<<(poVar5,"Template ");
      pcVar6 = Template::template_file(my_template);
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::operator<<(poVar5,": ");
      poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar5 = std::operator<<(poVar5,"Found end of different section than the one I am in");
      poVar5 = std::operator<<(poVar5,"\nFound: ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,(char *)token._0_8_,(ulong)token.text,&local_a9);
      poVar5 = std::operator<<(poVar5,local_a8);
      poVar5 = std::operator<<(poVar5,"\nIn: ");
      pcVar6 = (this->token_).text;
      uVar1 = (this->token_).textlen;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,pcVar6,uVar1,&local_d1);
      poVar5 = std::operator<<(poVar5,local_d0);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      Template::set_state(my_template,TS_ERROR);
    }
    std::__cxx11::string::clear();
    this_local._7_1_ = false;
    goto LAB_0014ebcc;
  case 5:
    token.modvals.
    super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
         AddTemplateNode(this,(TemplateToken *)local_58,my_template,&this->indentation_);
    std::__cxx11::string::clear();
    break;
  case 6:
    break;
  case 7:
    bVar2 = Template::ParseDelimiters
                      ((char *)token._0_8_,(size_t)token.text,
                       &(my_template->parse_state_).current_delimiters);
    if (!bVar2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar5 = std::operator<<(poVar5,"Template ");
      pcVar6 = Template::template_file(my_template);
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::operator<<(poVar5,": ");
      poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar5 = std::operator<<(poVar5,"Invalid delimiter-setting command.");
      poVar5 = std::operator<<(poVar5,"\nFound: ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,(char *)token._0_8_,(ulong)token.text,&local_f9);
      poVar5 = std::operator<<(poVar5,local_f8);
      poVar5 = std::operator<<(poVar5,"\nIn: ");
      pcVar6 = (this->token_).text;
      uVar1 = (this->token_).textlen;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,pcVar6,uVar1,&local_121);
      poVar5 = std::operator<<(poVar5,local_120);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      Template::set_state(my_template,TS_ERROR);
    }
    break;
  case 8:
    bVar2 = AddPragmaNode(this,(TemplateToken *)local_58,my_template);
    if (!bVar2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar5 = std::operator<<(poVar5,"Template ");
      pcVar6 = Template::template_file(my_template);
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::operator<<(poVar5,": ");
      poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
      poVar5 = std::operator<<(poVar5,"Pragma marker must be at the top of the template: \'");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,(char *)token._0_8_,(ulong)token.text,&local_149);
      poVar5 = std::operator<<(poVar5,local_148);
      poVar5 = std::operator<<(poVar5,"\'");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      Template::set_state(my_template,TS_ERROR);
    }
    break;
  case 9:
    this_local._7_1_ = false;
    goto LAB_0014ebcc;
  case 10:
    token.modvals.
    super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
         AddSectionNode(this,(TemplateToken *)local_58,my_template,true);
    std::__cxx11::string::clear();
    break;
  default:
    poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
    poVar5 = std::operator<<(poVar5,"Template ");
    pcVar6 = Template::template_file(my_template);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,": ");
    poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
    poVar5 = std::operator<<(poVar5,"Invalid token type returned from GetNextToken");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  if ((token.modvals.
       super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    Template::set_state(my_template,TS_ERROR);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
LAB_0014ebcc:
  local_d8 = 1;
  TemplateToken::~TemplateToken((TemplateToken *)local_58);
  return this_local._7_1_;
}

Assistant:

bool SectionTemplateNode::AddSubnode(Template *my_template) {
  bool auto_escape_success = true;
  // Don't proceed if we already found an error
  if (my_template->state() == TS_ERROR) {
    return false;
  }

  // Stop when the buffer is empty.
  if (my_template->parse_state_.bufstart >= my_template->parse_state_.bufend) {
    // running out of file contents ends the section too
    if (token_.text != kMainSectionName) {
      // if we are not in the main section, we have a syntax error in the file
      LOG_TEMPLATE_NAME(ERROR, my_template);
      LOG(ERROR) << "File ended before all sections were closed" << endl;
      my_template->set_state(TS_ERROR);
    }
    return false;
  }

  TemplateToken token = GetNextToken(my_template);

  switch (token.type) {
    case TOKENTYPE_TEXT:
      auto_escape_success = this->AddTextNode(&token, my_template);
      // Store the indentation (trailing whitespace after a newline), if any.
      this->indentation_ = GetIndentation(token.text, token.textlen,
                                          indentation_ == "\n");
      break;
    case TOKENTYPE_VARIABLE:
      auto_escape_success = this->AddVariableNode(&token, my_template);
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      break;
    case TOKENTYPE_SECTION_START:
      auto_escape_success = this->AddSectionNode(&token, my_template, false);
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      break;
    case TOKENTYPE_HIDDEN_DEFAULT_SECTION:
      auto_escape_success = this->AddSectionNode(&token, my_template, true);
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      break;
    case TOKENTYPE_SECTION_END:
      // Don't add a node. Just make sure we are ending the right section
      // and return false to indicate the section is complete
      if (token.textlen != token_.textlen ||
          memcmp(token.text, token_.text, token.textlen)) {
        LOG_TEMPLATE_NAME(ERROR, my_template);
        LOG(ERROR) << "Found end of different section than the one I am in"
                   << "\nFound: " << string(token.text, token.textlen)
                   << "\nIn: " << string(token_.text, token_.textlen) << endl;
        my_template->set_state(TS_ERROR);
      }
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      return false;
      break;
    case TOKENTYPE_TEMPLATE:
      auto_escape_success = this->AddTemplateNode(&token, my_template,
                                                  this->indentation_);
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      break;
    case TOKENTYPE_COMMENT:
      // Do nothing. Comments just drop out of the file altogether.
      break;
    case TOKENTYPE_SET_DELIMITERS:
      if (!Template::ParseDelimiters(
              token.text, token.textlen,
              &my_template->parse_state_.current_delimiters)) {
        LOG_TEMPLATE_NAME(ERROR, my_template);
        LOG(ERROR) << "Invalid delimiter-setting command."
                   << "\nFound: " << string(token.text, token.textlen)
                   << "\nIn: " << string(token_.text, token_.textlen) << endl;
        my_template->set_state(TS_ERROR);
      }
      break;
    case TOKENTYPE_PRAGMA:
      // We can do nothing and simply drop the pragma of the file as is done
      // for comments. But, there is value in keeping it for debug purposes
      // (via DumpToString) so add it as a pragma node.
      if (!this->AddPragmaNode(&token, my_template)) {
        LOG_TEMPLATE_NAME(ERROR, my_template);
        LOG(ERROR) << "Pragma marker must be at the top of the template: '"
                   << string(token.text, token.textlen) << "'" << endl;
        my_template->set_state(TS_ERROR);
      }
      break;
    case TOKENTYPE_NULL:
      // GetNextToken either hit the end of the file or a syntax error
      // in the file. Do nothing more here. Just return false to stop
      // processing.
      return false;
      break;
    default:
      // This shouldn't happen. If it does, it's a programmer error.
      LOG_TEMPLATE_NAME(ERROR, my_template);
      LOG(ERROR) << "Invalid token type returned from GetNextToken" << endl;
  }

  if (!auto_escape_success) {
    // The error is logged where it happens. Here indicate
    // the initialization failed.
    my_template->set_state(TS_ERROR);
    return false;
  }

  // for all the cases where we did not return false
  return true;
}